

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,hugeint_t param,uhugeint_t params,uhugeint_t params_1)

{
  uint64_t uVar1;
  hugeint_t value;
  uhugeint_t param_00;
  undefined1 local_60 [56];
  
  uVar1 = param.upper;
  value.upper = (int64_t)values;
  value.lower = param.lower;
  ExceptionFormatValue::CreateFormatValue<duckdb::hugeint_t>
            ((ExceptionFormatValue *)local_60,(ExceptionFormatValue *)values,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)local_60);
  ::std::__cxx11::string::~string((string *)(local_60 + 0x18));
  param_00.upper = uVar1;
  param_00.lower = params.upper;
  ConstructMessageRecursive<duckdb::uhugeint_t,duckdb::uhugeint_t>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             params.lower,param_00,params_1);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}